

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::synchronization::GraphicsPipelineBuilder::build
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkPipelineLayout pipelineLayout,VkRenderPass renderPass,
          PipelineCacheData *pipelineCacheData)

{
  VkPipelineDepthStencilStateCreateInfo *pVVar1;
  uint uVar2;
  Move<vk::Handle<(vk::HandleType)18>_> *pipeline;
  VkPrimitiveTopology VVar3;
  ulong uVar4;
  bool bVar5;
  Unique<vk::Handle<(vk::HandleType)15>_> pipelineCache;
  VkRect2D scissor;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  Deleter<vk::Handle<(vk::HandleType)15>_> DStack_2f0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [48];
  Move<vk::Handle<(vk::HandleType)15>_> local_298;
  VkPipelineInputAssemblyStateCreateInfo local_278;
  uint local_258 [8];
  undefined1 local_238 [64];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 *local_1e8;
  deUint32 local_1e0;
  undefined8 *local_1d8;
  VkPipelineVertexInputStateCreateInfo local_1d0;
  undefined1 local_1a0 [40];
  undefined1 local_178 [24];
  undefined8 local_160;
  undefined8 uStack_158;
  VkCompareOp local_150;
  deUint32 local_14c;
  VkCullModeFlags local_148;
  VkFrontFace local_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_130;
  VkPipelineDepthStencilStateCreateInfo local_128;
  VkGraphicsPipelineCreateInfo local_c0;
  
  local_c0.pVertexInputState = &local_1d0;
  local_1d0.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  pVVar1 = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  local_1d0.pNext = (void *)0x0;
  local_1d0.flags = 0;
  local_1d0.pVertexBindingDescriptions =
       (this->m_vertexInputBindings).
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_vertexInputBindings).
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1d0.pVertexBindingDescriptions;
  if (uVar4 == 0) {
    local_1d0.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)pVVar1;
  }
  local_1d0.vertexBindingDescriptionCount = (int)(uVar4 >> 2) * -0x55555555;
  local_1d0.pVertexAttributeDescriptions =
       (this->m_vertexInputAttributes).
       super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_vertexInputAttributes).
                super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1d0.pVertexAttributeDescriptions;
  if (uVar4 == 0) {
    local_1d0.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)pVVar1;
  }
  local_1d0.vertexAttributeDescriptionCount = (deUint32)(uVar4 >> 4);
  bVar5 = (this->m_shaderStageFlags & 2) == 0;
  VVar3 = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
  if (bVar5) {
    VVar3 = this->m_primitiveTopology;
  }
  local_c0.pInputAssemblyState = &local_278;
  local_278.pNext = (void *)0x0;
  local_278.primitiveRestartEnable = 0;
  local_278._28_4_ = 0;
  local_278.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_278._4_4_ = 0;
  local_278._16_8_ = (ulong)VVar3 << 0x20;
  local_2c8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_2c8._8_8_ = (void *)0x0;
  local_2c8._16_4_ = 0;
  local_2c8._20_4_ = this->m_patchControlPoints;
  local_2d0 = *(undefined8 *)(this->m_renderSize).m_data;
  local_2c8._32_4_ = (undefined4)(this->m_renderSize).m_data[0];
  local_2c8._36_4_ = (undefined4)(this->m_renderSize).m_data[1];
  local_1e8 = local_2c8 + 0x18;
  local_2c8._24_4_ = 0;
  local_2c8._28_4_ = VK_COMPARE_OP_NEVER;
  local_2c8._40_4_ = VK_STENCIL_OP_KEEP;
  local_2c8._44_4_ = 0x3f800000;
  local_c0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_2c8;
  if (bVar5) {
    local_c0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)pVVar1;
  }
  local_1d8 = &local_2d8;
  local_2d8 = 0;
  local_238._56_4_ = 0x16;
  local_1f8._0_4_ = 0;
  local_1f8._4_4_ = VK_STENCIL_OP_KEEP;
  local_1f0._0_4_ = VK_STENCIL_OP_KEEP;
  local_1f0._4_4_ = VK_STENCIL_OP_ZERO;
  local_1e0 = 1;
  local_c0.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)(local_178 + 0x10);
  local_178._16_4_ = 0x17;
  uVar2 = this->m_shaderStageFlags & 0x10;
  local_150 = uVar2 >> 4 ^ VK_COMPARE_OP_LESS;
  local_160._0_4_ = 0;
  local_160._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_158._0_4_ = VK_STENCIL_OP_KEEP;
  uStack_158._4_4_ = VK_STENCIL_OP_KEEP;
  local_14c = 0;
  local_148 = this->m_cullModeFlags;
  local_144 = this->m_frontFace;
  local_238._8_8_ = (void *)0x0;
  local_238._24_4_ = 0;
  local_238._28_4_ = VK_COMPARE_OP_NEVER;
  local_238._32_4_ = 0;
  local_238._36_4_ = 0;
  local_238._40_4_ = VK_STENCIL_OP_KEEP;
  local_238._44_4_ = VK_STENCIL_OP_KEEP;
  local_238._0_8_ = 0x18;
  local_238._16_4_ = 0;
  local_238._20_4_ = 1;
  local_128.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_128.depthWriteEnable = 0;
  local_128.depthCompareOp = VK_COMPARE_OP_LESS;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.depthTestEnable = 0;
  local_128.minDepthBounds = 0.0;
  local_128.maxDepthBounds = 1.0;
  local_140._0_4_ = 0.0;
  local_140._4_4_ = 0.0;
  uStack_138 = 0;
  local_130 = 0x3f800000;
  local_128.depthBoundsTestEnable = 0;
  local_128.stencilTestEnable = 0;
  local_128.front.failOp = VK_STENCIL_OP_KEEP;
  local_128.front.passOp = VK_STENCIL_OP_KEEP;
  local_128.front.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.front.compareOp = VK_COMPARE_OP_NEVER;
  local_128.front.compareMask = 0;
  local_128.front.writeMask = 0;
  local_128.front.reference = 0;
  local_128.back.failOp = VK_STENCIL_OP_KEEP;
  local_128.back.passOp = VK_STENCIL_OP_KEEP;
  local_128.back.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.back.compareOp = VK_COMPARE_OP_NEVER;
  local_128.back.compareMask = 0;
  local_128.back.writeMask = 0;
  local_128.back.reference = 0;
  local_1a0._32_8_ = local_258;
  local_258[0] = (uint)this->m_blendEnable;
  local_1a0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_1a0._8_8_ = (void *)0x0;
  local_1a0._16_4_ = 0;
  local_1a0._20_4_ = 0;
  local_1a0._24_4_ = 3;
  local_1a0._28_4_ = VK_COMPARE_OP_LESS;
  local_258[1] = 6;
  local_258[2] = 1;
  local_258[3] = 0;
  local_258[4] = 6;
  local_258[5] = 1;
  local_258[6] = 0;
  local_258[7] = 0xf;
  local_178._0_4_ = VK_STENCIL_OP_KEEP;
  local_178._4_4_ = VK_STENCIL_OP_KEEP;
  local_178._8_4_ = VK_STENCIL_OP_KEEP;
  local_178._12_4_ = VK_COMPARE_OP_NEVER;
  local_c0.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_c0.pNext = (void *)0x0;
  local_c0.flags = 0;
  local_c0.pStages =
       (this->m_shaderStages).
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c0.stageCount =
       (int)((ulong)((long)(this->m_shaderStages).
                           super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)local_c0.pStages) >> 4
            ) * -0x55555555;
  local_c0.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)local_1a0;
  local_c0.pViewportState = (VkPipelineViewportStateCreateInfo *)(local_238 + 0x38);
  local_c0.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)local_238;
  local_c0.pDepthStencilState = &local_128;
  if (uVar2 == 0) {
    local_c0.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)pVVar1;
    local_c0.pViewportState = (VkPipelineViewportStateCreateInfo *)pVVar1;
    local_c0.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)pVVar1;
    local_c0.pDepthStencilState = pVVar1;
  }
  local_c0.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_c0.subpass = 0;
  local_c0.basePipelineHandle.m_internal = 0;
  local_c0.basePipelineIndex = 0;
  local_c0.layout.m_internal = pipelineLayout.m_internal;
  local_c0.renderPass.m_internal = renderPass.m_internal;
  PipelineCacheData::createPipelineCache(&local_298,pipelineCacheData,vk,device);
  DStack_2f0.m_device =
       local_298.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  DStack_2f0.m_allocator =
       local_298.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  DStack_2f0.m_deviceIface =
       local_298.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,
             (VkPipelineCache)
             local_298.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
             &local_c0,(VkAllocationCallbacks *)0x0);
  PipelineCacheData::setFromPipelineCache
            (pipelineCacheData,vk,device,
             (VkPipelineCache)
             local_298.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal);
  if (local_298.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
              (&DStack_2f0,
               (VkPipelineCache)
               local_298.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> GraphicsPipelineBuilder::build (const DeviceInterface&	vk,
												 const VkDevice			device,
												 const VkPipelineLayout	pipelineLayout,
												 const VkRenderPass		renderPass,
												 PipelineCacheData&		pipelineCacheData)
{
	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		static_cast<deUint32>(m_vertexInputBindings.size()),			// uint32_t                                    vertexBindingDescriptionCount;
		dataPointer(m_vertexInputBindings),								// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		static_cast<deUint32>(m_vertexInputAttributes.size()),			// uint32_t                                    vertexAttributeDescriptionCount;
		dataPointer(m_vertexInputAttributes),							// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPrimitiveTopology topology = (m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST
																										 : m_primitiveTopology;
	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags      flags;
		m_patchControlPoints,											// uint32_t                                    patchControlPoints;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(m_renderSize.x()), static_cast<float>(m_renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(m_renderSize.x(), m_renderSize.y()),
	};

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,												// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags          flags;
		1u,														// uint32_t                                    viewportCount;
		&viewport,												// const VkViewport*                           pViewports;
		1u,														// uint32_t                                    scissorCount;
		&scissor,												// const VkRect2D*                             pScissors;
	};

	const bool isRasterizationDisabled = ((m_shaderStageFlags & VK_SHADER_STAGE_FRAGMENT_BIT) == 0);
	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		isRasterizationDisabled,										// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		m_cullModeFlags,												// VkCullModeFlags							cullMode;
		m_frontFace,													// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,		// stencil fail
		VK_STENCIL_OP_KEEP,		// depth & stencil pass
		VK_STENCIL_OP_KEEP,		// depth only fail
		VK_COMPARE_OP_NEVER,	// compare op
		0u,						// compare mask
		0u,						// write mask
		0u);					// reference

	const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		VK_FALSE,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		m_blendEnable,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
		colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
		DE_NULL,																// const void*										pNext;
		(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
		static_cast<deUint32>(m_shaderStages.size()),							// deUint32											stageCount;
		&m_shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		(m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? &pipelineTessellationStateInfo : DE_NULL), // const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineViewportStateInfo),		// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineMultisampleStateInfo),	// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		(isRasterizationDisabled ? DE_NULL : &pipelineDepthStencilStateInfo),	// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		(isRasterizationDisabled ? DE_NULL : &pipelineColorBlendStateInfo),		// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		DE_NULL,																// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,															// VkPipelineLayout									layout;
		renderPass,																// VkRenderPass										renderPass;
		0u,																		// deUint32											subpass;
		DE_NULL,																// VkPipeline										basePipelineHandle;
		0,																		// deInt32											basePipelineIndex;
	};

	{
		const vk::Unique<vk::VkPipelineCache>	pipelineCache	(pipelineCacheData.createPipelineCache(vk, device));
		vk::Move<vk::VkPipeline>				pipeline		(createGraphicsPipeline(vk, device, *pipelineCache, &graphicsPipelineInfo));

		// Refresh data from cache
		pipelineCacheData.setFromPipelineCache(vk, device, *pipelineCache);

		return pipeline;
	}
}